

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDEdge * __thiscall
ON_SubD::AddEdge(ON_SubD *this,ON_SubDEdgeTag edge_tag,ON_SubDVertex *v0,ON_SubDVertex *v1)

{
  ON_SubDEdge *pOVar1;
  
  pOVar1 = AddEdgeWithSectorCoefficients(this,edge_tag,v0,-8883.0,v1,-8883.0);
  return pOVar1;
}

Assistant:

class ON_SubDEdge* ON_SubD::AddEdge(
  ON_SubDEdgeTag edge_tag,
  ON_SubDVertex* v0,
  ON_SubDVertex* v1
  )
{
  // NO automatic edge tag setting - causes more problems than it helps.
  // Users can call ON_SubD::EdgeTagFromContext() if they want to
  // preset the edge tag based on context.

  return AddEdgeWithSectorCoefficients(
    edge_tag,
    v0,
    ON_SubDSectorType::UnsetSectorCoefficient,
    v1,
    ON_SubDSectorType::UnsetSectorCoefficient
    );
}